

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O3

void __thiscall Screen_Manager::Remove(Screen_Manager *this,Screen_Info *screen)

{
  uint uVar1;
  __fd_mask *p_Var2;
  Screen_Info *pSVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Screen_Info *pSVar8;
  
  if (this->head == screen) {
    pSVar8 = (Screen_Info *)0x0;
    if (screen->next != screen) {
      pSVar8 = screen->next;
    }
    this->head = pSVar8;
  }
  iVar5 = XConnectionNumber(screen->dpy);
  bVar4 = (byte)iVar5 & 0x3f;
  iVar7 = iVar5 + 0x3f;
  if (-1 < iVar5) {
    iVar7 = iVar5;
  }
  p_Var2 = (this->read_flag).fds_bits + (iVar7 >> 6);
  *p_Var2 = *p_Var2 & (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
  if (0 < this->nfds) {
    uVar6 = this->nfds + 1;
    do {
      uVar1 = uVar6 - 2;
      if (((ulong)(this->read_flag).fds_bits[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0) break;
      this->nfds = uVar1;
      uVar6 = uVar6 - 1;
    } while (1 < uVar6);
  }
  pSVar8 = screen->next;
  pSVar3 = screen->prev;
  pSVar8->prev = pSVar3;
  pSVar3->next = pSVar8;
  if (screen->name != (char *)0x0) {
    operator_delete__(screen->name);
  }
  operator_delete(screen);
  return;
}

Assistant:

void
Screen_Manager::Remove(Screen_Manager::Screen_Info *screen)
{
  if (head == screen)
    head = (screen->next == screen) ? nullptr : screen->next;

  int fd = XConnectionNumber(screen->dpy);
  FD_CLR(fd, &read_flag);
  while (nfds > 0 && !FD_ISSET(nfds - 1, &read_flag))
    --nfds;

  screen->next->prev = screen->prev;
  screen->prev->next = screen->next;
  delete screen;
}